

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<double>_>::Transpose(TPZMatrix<Fad<double>_> *this,TPZMatrix<Fad<double>_> *T)

{
  long lVar1;
  long *plVar2;
  int64_t iVar3;
  int64_t iVar4;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t c;
  int64_t r;
  Fad<double> *pFVar5;
  undefined1 local_40 [32];
  Fad<double> *local_20;
  long local_18;
  long *local_10;
  
  local_10 = in_RSI;
  iVar3 = TPZBaseMatrix::Cols(in_RDI);
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  (**(code **)(*in_RSI + 0x68))(in_RSI,iVar3,iVar4);
  local_18 = 0;
  while( true ) {
    lVar1 = local_18;
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar3 <= lVar1) break;
    local_20 = (Fad<double> *)0x0;
    while( true ) {
      pFVar5 = local_20;
      iVar3 = TPZBaseMatrix::Cols(in_RDI);
      plVar2 = local_10;
      lVar1 = local_18;
      if (iVar3 <= (long)pFVar5) break;
      pFVar5 = local_20;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
      (**(code **)(*plVar2 + 0x118))(plVar2,pFVar5,lVar1,local_40);
      Fad<double>::~Fad(pFVar5);
      local_20 = (Fad<double> *)((long)&local_20->val_ + 1);
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Transpose(TPZMatrix<TVar> *T) const {
	T->Resize( Cols(), Rows() );
	
	for ( int64_t r = 0; r < Rows(); r++ ) {
        for ( int64_t c = 0; c < Cols(); c++ ) {
            T->PutVal( c, r, GetVal( r, c ) );
        }
    }
}